

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void OpenSimpleHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  AnonSimpleFile *this;
  mapped_type *ppAVar4;
  _OpenSimpleResponseMsg open_response_msg;
  key_type local_88;
  CMConnection local_80;
  string local_78;
  ulong local_58;
  int64_t iStack_50;
  size_t local_48;
  undefined8 uStack_40;
  
  local_80 = conn;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Got an open simple request for file ",0x24);
  pcVar1 = *(char **)((long)vevent + 8);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1441e8);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  this = (AnonSimpleFile *)operator_new(0x50);
  std::__cxx11::string::string
            ((string *)&local_78,*(char **)((long)vevent + 8),(allocator *)&local_88);
  AnonSimpleFile::AnonSimpleFile(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pcVar1 = *(char **)((long)vevent + 8);
  pcVar2 = (char *)(this->m_FileName)._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)&this->m_FileName,0,pcVar2,(ulong)pcVar1);
  uStack_40 = 0;
  iStack_50 = this->m_ID;
  local_48 = this->m_Size;
  local_58 = (ulong)*vevent;
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x20));
  CMconn_register_close_handler(conn,ConnCloseHandler,0);
  local_88 = this->m_ID;
  ppAVar4 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&SimpleFileMap,&local_88);
  *ppAVar4 = this;
  std::
  _Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<_CMConnection*&,long&>
            ((_Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&ConnToFileMap,0,&local_80,this);
  SimpleFilesOpened = SimpleFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  return;
}

Assistant:

static void OpenSimpleHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    OpenSimpleFileMsg open_msg = static_cast<OpenSimpleFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenSimpleResponseMsg open_response_msg;
    std::cout << "Got an open simple request for file " << open_msg->FileName << std::endl;
    AnonSimpleFile *f = new AnonSimpleFile(open_msg->FileName);
    f->m_FileName = open_msg->FileName;
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.FileSize = f->m_Size;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;

    CMwrite(conn, ev_state->OpenSimpleResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    SimpleFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    SimpleFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}